

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvafuzz.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  time_t tVar4;
  uint uVar5;
  uint32_t val;
  uint32_t reg;
  int32_t b;
  int32_t a;
  int cnum;
  int c;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _cnum = argv;
  argv_local._0_4_ = argc;
  iVar1 = nva_init();
  if (iVar1 == 0) {
    b = 0;
    while (a = getopt((int)argv_local,_cnum,"hc:"), a != -1) {
      if (a == 99) {
        __isoc99_sscanf(_optarg,"%d",&b);
      }
      else {
        if (a == 0x68) {
          usage(0);
        }
        usage(1);
      }
    }
    if (b < nva_cardsnum) {
      val = 4;
      if (_optind < (int)argv_local) {
        __isoc99_sscanf(_cnum[_optind],"%x",&reg);
        if (_optind + 1 < (int)argv_local) {
          __isoc99_sscanf(_cnum[_optind + 1],"%x",&val);
        }
        tVar4 = time((time_t *)0x0);
        uVar2 = nva_rd32(b,0x9400);
        srand((int)tVar4 + uVar2);
        do {
          uVar2 = reg;
          uVar3 = proper_rand(0x18);
          uVar5 = uVar3 % val;
          uVar3 = proper_rand(0x20);
          nva_wr32(b,uVar2 + uVar5 & 0xfffffc,uVar3);
        } while( true );
      }
      fprintf(_stderr,"No address specified.\n");
    }
    else if (nva_cardsnum == 0) {
      fprintf(_stderr,"No cards found.\n");
    }
    else {
      fprintf(_stderr,"No such card.\n");
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "hc:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 'h':
				usage(0);
			default:
				usage(1);
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 4;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	srand(time(0) + nva_rd32(cnum, 0x9400));
	while (1) {
		uint32_t reg = (a + proper_rand(24) % b) & 0xfffffc;
		uint32_t val = proper_rand(32);
		nva_wr32(cnum, reg, val);
	}
	return 0;
}